

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

boolean rob_shop(monst *shkp)

{
  uint uVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  int *piVar6;
  
  rouse_shk(shkp,'\x01');
  iVar5 = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2);
  if (iVar5 == 0) {
    lVar3 = 0;
  }
  else {
    piVar6 = (int *)(*(long *)&shkp[0x1b].mnum + 0xc);
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (long)*piVar6 * (long)piVar6[-1];
      piVar6 = piVar6 + 4;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  lVar3 = *(int *)&shkp[0x1b].field_0x60 + lVar3;
  uVar1 = shkp[0x1b].mappearance;
  if ((int)uVar1 < lVar3) {
    pline("You escaped the shop without paying!");
    lVar3 = lVar3 - (int)shkp[0x1b].mappearance;
  }
  else {
    pcVar4 = currency((long)(int)uVar1);
    lVar3 = 0;
    pline("Your credit of %ld %s is used to cover your shopping bill.",(ulong)uVar1,pcVar4);
  }
  setpaid(shkp);
  if (lVar3 == 0) {
    bVar2 = '\0';
  }
  else {
    *(int *)&shkp[0x1b].mtame = *(int *)&shkp[0x1b].mtame + (int)lVar3;
    pcVar4 = currency(lVar3);
    pline("You stole %ld %s worth of merchandise.",lVar3,pcVar4);
    if (urole.malenum != 0x164) {
      iVar5 = sgn((int)u.ualign.type);
      adjalign(-iVar5);
    }
    hot_pursuit(shkp);
    bVar2 = '\x01';
  }
  return bVar2;
}

Assistant:

static boolean rob_shop(struct monst *shkp)
{
	struct eshk *eshkp;
	long total;

	eshkp = ESHK(shkp);
	rouse_shk(shkp, TRUE);
	total = (addupbill(shkp) + eshkp->debit);
	if (eshkp->credit >= total) {
	    pline("Your credit of %ld %s is used to cover your shopping bill.",
		 eshkp->credit, currency(eshkp->credit));
	    total = 0L;		/* credit gets cleared by setpaid() */
	} else {
	    pline("You escaped the shop without paying!");
	    total -= eshkp->credit;
	}
	setpaid(shkp);
	if (!total) return FALSE;

	/* by this point, we know an actual robbery has taken place */
	eshkp->robbed += total;
	pline("You stole %ld %s worth of merchandise.",
	    total, currency(total));
	if (!Role_if (PM_ROGUE))	/* stealing is unlawful */
	    adjalign(-sgn(u.ualign.type));

	hot_pursuit(shkp);
	return TRUE;
}